

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::InputScalar(char *label,ImGuiDataType data_type,void *data_ptr,void *step,
                       void *step_fast,char *format,ImGuiInputTextFlags extra_flags)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  float fVar3;
  ImGuiWindow *pIVar4;
  char *text_end;
  float fVar5;
  void *local_f8;
  void *local_d8;
  bool local_b1;
  ImVec2 local_b0;
  ImVec2 local_a8;
  float local_a0;
  byte local_99;
  float button_size;
  bool value_changed;
  char buf [64];
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  char *format_local;
  void *step_fast_local;
  void *step_local;
  void *data_ptr_local;
  ImGuiDataType data_type_local;
  char *label_local;
  
  pIVar4 = GetCurrentWindow();
  pIVar1 = GImGui;
  if ((pIVar4->SkipItems & 1U) == 0) {
    buf._56_8_ = &GImGui->Style;
    local_b1 = 5 < (uint)data_type;
    if (local_b1) {
      __assert_fail("data_type >= 0 && data_type < ImGuiDataType_COUNT",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x2a37,
                    "bool ImGui::InputScalar(const char *, ImGuiDataType, void *, const void *, const void *, const char *, ImGuiInputTextFlags)"
                   );
    }
    window = (ImGuiWindow *)format;
    if (format == (char *)0x0) {
      window = (ImGuiWindow *)GDataTypeInfo[data_type].PrintFmt;
    }
    DataTypeFormatString((char *)&button_size,0x40,data_type,data_ptr,(char *)window);
    local_99 = 0;
    if ((extra_flags & 0x20002U) == 0) {
      extra_flags = extra_flags | 1;
    }
    if (step == (void *)0x0) {
      bVar2 = InputText(label,(char *)&button_size,0x40,extra_flags | 0x10U,
                        (ImGuiTextEditCallback)0x0,(void *)0x0);
      if (bVar2) {
        local_99 = DataTypeApplyOpFromText
                             ((char *)&button_size,(pIVar1->InputTextState).InitialText.Data,
                              data_type,data_ptr,(char *)window);
      }
    }
    else {
      local_a0 = GetFrameHeight();
      BeginGroup();
      PushID(label);
      fVar5 = CalcItemWidth();
      fVar3 = -(local_a0 + *(float *)(buf._56_8_ + 0x4c));
      fVar3 = ImMax<float>(1.0,fVar3 + fVar3 + fVar5);
      PushItemWidth(fVar3);
      bVar2 = InputText("",(char *)&button_size,0x40,extra_flags | 0x10U,(ImGuiTextEditCallback)0x0,
                        (void *)0x0);
      if (bVar2) {
        local_99 = DataTypeApplyOpFromText
                             ((char *)&button_size,(pIVar1->InputTextState).InitialText.Data,
                              data_type,data_ptr,(char *)window);
      }
      PopItemWidth();
      SameLine(0.0,*(float *)(buf._56_8_ + 0x4c));
      ImVec2::ImVec2(&local_a8,local_a0,local_a0);
      bVar2 = ButtonEx("-",&local_a8,0x81);
      if (bVar2) {
        local_d8 = step;
        if ((((pIVar1->IO).KeyCtrl & 1U) != 0) && (step_fast != (void *)0x0)) {
          local_d8 = step_fast;
        }
        DataTypeApplyOp(data_type,0x2d,data_ptr,data_ptr,local_d8);
        local_99 = 1;
      }
      SameLine(0.0,*(float *)(buf._56_8_ + 0x4c));
      ImVec2::ImVec2(&local_b0,local_a0,local_a0);
      bVar2 = ButtonEx("+",&local_b0,0x81);
      if (bVar2) {
        local_f8 = step;
        if ((((pIVar1->IO).KeyCtrl & 1U) != 0) && (step_fast != (void *)0x0)) {
          local_f8 = step_fast;
        }
        DataTypeApplyOp(data_type,0x2b,data_ptr,data_ptr,local_f8);
        local_99 = 1;
      }
      SameLine(0.0,*(float *)(buf._56_8_ + 0x4c));
      text_end = FindRenderedTextEnd(label,(char *)0x0);
      TextUnformatted(label,text_end);
      PopID();
      EndGroup();
    }
    label_local._7_1_ = (bool)(local_99 & 1);
  }
  else {
    label_local._7_1_ = false;
  }
  return label_local._7_1_;
}

Assistant:

bool ImGui::InputScalar(const char* label, ImGuiDataType data_type, void* data_ptr, const void* step, const void* step_fast, const char* format, ImGuiInputTextFlags extra_flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    IM_ASSERT(data_type >= 0 && data_type < ImGuiDataType_COUNT);
    if (format == NULL)
        format = GDataTypeInfo[data_type].PrintFmt;

    char buf[64];
    DataTypeFormatString(buf, IM_ARRAYSIZE(buf), data_type, data_ptr, format);

    bool value_changed = false;
    if ((extra_flags & (ImGuiInputTextFlags_CharsHexadecimal | ImGuiInputTextFlags_CharsScientific)) == 0)
        extra_flags |= ImGuiInputTextFlags_CharsDecimal;
    extra_flags |= ImGuiInputTextFlags_AutoSelectAll;

    if (step != NULL)
    {
        const float button_size = GetFrameHeight();

        BeginGroup(); // The only purpose of the group here is to allow the caller to query item data e.g. IsItemActive()
        PushID(label);
        PushItemWidth(ImMax(1.0f, CalcItemWidth() - (button_size + style.ItemInnerSpacing.x) * 2));
        if (InputText("", buf, IM_ARRAYSIZE(buf), extra_flags)) // PushId(label) + "" gives us the expected ID from outside point of view
            value_changed = DataTypeApplyOpFromText(buf, g.InputTextState.InitialText.Data, data_type, data_ptr, format);
        PopItemWidth();

        // Step buttons
        SameLine(0, style.ItemInnerSpacing.x);
        if (ButtonEx("-", ImVec2(button_size, button_size), ImGuiButtonFlags_Repeat | ImGuiButtonFlags_DontClosePopups))
        {
            DataTypeApplyOp(data_type, '-', data_ptr, data_ptr, g.IO.KeyCtrl && step_fast ? step_fast : step);
            value_changed = true;
        }
        SameLine(0, style.ItemInnerSpacing.x);
        if (ButtonEx("+", ImVec2(button_size, button_size), ImGuiButtonFlags_Repeat | ImGuiButtonFlags_DontClosePopups))
        {
            DataTypeApplyOp(data_type, '+', data_ptr, data_ptr, g.IO.KeyCtrl && step_fast ? step_fast : step);
            value_changed = true;
        }
        SameLine(0, style.ItemInnerSpacing.x);
        TextUnformatted(label, FindRenderedTextEnd(label));

        PopID();
        EndGroup();
    }
    else
    {
        if (InputText(label, buf, IM_ARRAYSIZE(buf), extra_flags))
            value_changed = DataTypeApplyOpFromText(buf, g.InputTextState.InitialText.Data, data_type, data_ptr, format);
    }

    return value_changed;
}